

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseVectorOrArrayTypeSuffixes
          (StructuralParser *this,Expression *elementType,ParseTypeContext parseContext)

{
  char *pcVar1;
  bool bVar2;
  SubscriptWithChevrons *t;
  SourceCodeText *o;
  pool_ptr<soul::AST::Expression> size;
  Context context;
  undefined1 local_88 [16];
  UTF8Reader local_78;
  Ptr local_70;
  CompileMessage local_68;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pcVar1 = (this->super_SOULTokeniser).location.location.data;
  local_70.object = (SourceCodeText *)this->currentScope;
  local_88._8_8_ = o;
  local_78.data = pcVar1;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fc0);
  if (bVar2) {
    this->ignoreGreaterThanToken = this->ignoreGreaterThanToken + 1;
    tryToParseExpressionIgnoringErrors((StructuralParser *)local_88);
    this->ignoreGreaterThanToken = this->ignoreGreaterThanToken + -1;
    if ((Expression *)local_88._0_8_ != (Expression *)0x0) {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27fdaf);
      if (bVar2) {
        pcVar1 = (this->super_SOULTokeniser).currentType.text;
        if ((pcVar1 == "<") ||
           (((pcVar1 != (char *)0x0 && (*pcVar1 == '<')) && (pcVar1[1] == '\0')))) {
          CompileMessageHelpers::createMessage<>
                    (&local_68,syntax,error,
                     "Cannot create a vector with elements that are not primitive types");
          (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_68);
          RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
            operator_delete(local_68.description._M_dataplus._M_p,
                            local_68.description.field_2._M_allocated_capacity + 1);
          }
        }
        if ((Expression *)local_88._0_8_ == (Expression *)0x0) {
          throwInternalCompilerError("object != nullptr","operator*",0x3b);
        }
        t = PoolAllocator::
            allocate<soul::AST::SubscriptWithChevrons,soul::AST::Context&,soul::AST::Expression&,soul::AST::Expression&>
                      (&this->allocator->pool,(Context *)(local_88 + 8),elementType,
                       (Expression *)local_88._0_8_);
        elementType = parseArrayTypeSuffixes(this,&t->super_Expression,parseContext);
        o = (SourceCodeText *)local_88._8_8_;
        goto LAB_001d697f;
      }
    }
    if ((this->super_SOULTokeniser).input.data != pcVar1) {
      (this->super_SOULTokeniser).input.data = pcVar1;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
    }
  }
  else {
    elementType = parseArrayTypeSuffixes(this,elementType,parseContext);
  }
LAB_001d697f:
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  return elementType;
}

Assistant:

AST::Expression& parseVectorOrArrayTypeSuffixes (AST::Expression& elementType, ParseTypeContext parseContext)
    {
        auto context = getContext();
        auto startPos = getCurrentTokeniserPosition();

        if (! matchIf (Operator::lessThan))
            return parseArrayTypeSuffixes (elementType, parseContext);

        ++ignoreGreaterThanToken;
        auto size = tryToParseExpressionIgnoringErrors();
        --ignoreGreaterThanToken;

        if (size == nullptr || ! matchIf (Operator::greaterThan))
        {
            resetPosition (startPos);
            return elementType;
        }

        if (matches (Operator::lessThan))
            throwError (Errors::wrongTypeForVectorElement());

        auto& e = allocate<AST::SubscriptWithChevrons> (context, elementType, *size);
        return parseArrayTypeSuffixes (e, parseContext);
    }